

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O0

void ZopfliCostModelSetFromLiteralCosts
               (ZopfliCostModel *self,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask)

{
  float fVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  size_t *in_RCX;
  uint8_t *in_RDX;
  size_t in_RSI;
  size_t in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  size_t i;
  size_t num_bytes;
  float *cost_cmd;
  float *cost_dist;
  float literal_carry;
  float *literal_costs;
  ulong local_80;
  float local_5c;
  float *cost;
  size_t sVar7;
  size_t in_stack_ffffffffffffffd0;
  double local_18;
  double local_8;
  
  cost = *(float **)(in_RDI + 0xb10);
  local_5c = 0.0;
  lVar2 = *(long *)(in_RDI + 0xb00);
  uVar4 = *(ulong *)(in_RDI + 0xb20);
  sVar7 = in_RDI;
  duckdb_brotli::BrotliEstimateBitCostsForLiterals
            (in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,cost);
  *cost = 0.0;
  for (local_80 = 0; local_80 < uVar4; local_80 = local_80 + 1) {
    fVar1 = cost[local_80 + 1];
    cost[local_80 + 1] = cost[local_80] + fVar1 + local_5c;
    local_5c = (fVar1 + local_5c) - (cost[local_80 + 1] - cost[local_80]);
  }
  for (local_80 = 0; local_80 < 0x2c0; local_80 = local_80 + 1) {
    uVar3 = (int)local_80 + 0xb;
    uVar4 = CONCAT44(0,uVar3);
    if (uVar4 < 0x100) {
      local_8 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar4 * 8);
    }
    else {
      auVar5._8_4_ = 0;
      auVar5._0_8_ = uVar4;
      auVar5._12_4_ = 0x45300000;
      local_8 = log2((auVar5._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,uVar3) - 4503599627370496.0));
    }
    *(float *)(in_RDI + local_80 * 4) = (float)local_8;
  }
  for (local_80 = 0; local_80 < *(uint *)(sVar7 + 0xb08); local_80 = local_80 + 1) {
    uVar3 = (int)local_80 + 0x14;
    uVar4 = CONCAT44(0,uVar3);
    if (uVar4 < 0x100) {
      local_18 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar4 * 8);
    }
    else {
      auVar6._8_4_ = 0;
      auVar6._0_8_ = uVar4;
      auVar6._12_4_ = 0x45300000;
      local_18 = log2((auVar6._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,uVar3) - 4503599627370496.0));
    }
    *(float *)(lVar2 + local_80 * 4) = (float)local_18;
  }
  *(undefined4 *)(sVar7 + 0xb18) = 0x405d6754;
  return;
}

Assistant:

static void ZopfliCostModelSetFromLiteralCosts(ZopfliCostModel* self,
                                               size_t position,
                                               const uint8_t* ringbuffer,
                                               size_t ringbuffer_mask) {
  float* literal_costs = self->literal_costs_;
  float literal_carry = 0.0;
  float* cost_dist = self->cost_dist_;
  float* cost_cmd = self->cost_cmd_;
  size_t num_bytes = self->num_bytes_;
  size_t i;
  BrotliEstimateBitCostsForLiterals(position, num_bytes, ringbuffer_mask,
                                    ringbuffer, self->literal_histograms,
                                    &literal_costs[1]);
  literal_costs[0] = 0.0;
  for (i = 0; i < num_bytes; ++i) {
    literal_carry += literal_costs[i + 1];
    literal_costs[i + 1] = literal_costs[i] + literal_carry;
    literal_carry -= literal_costs[i + 1] - literal_costs[i];
  }
  for (i = 0; i < BROTLI_NUM_COMMAND_SYMBOLS; ++i) {
    cost_cmd[i] = (float)FastLog2(11 + (uint32_t)i);
  }
  for (i = 0; i < self->distance_histogram_size; ++i) {
    cost_dist[i] = (float)FastLog2(20 + (uint32_t)i);
  }
  self->min_cost_cmd_ = (float)FastLog2(11);
}